

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImageLoaderJPG.cpp
# Opt level: O0

IImage * __thiscall irr::video::CImageLoaderJPG::loadImage(CImageLoaderJPG *this,IReadFile *file)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  void *pvVar5;
  undefined8 uVar6;
  IImage *pIVar7;
  dimension2d<unsigned_int> *in_RSI;
  u32 j;
  u32 i_1;
  u8 *data;
  u32 size;
  IImage *image;
  u32 rowsRead;
  u32 i;
  u8 *output;
  u32 height;
  u32 width;
  u32 rowspan;
  bool useCMYK;
  jpeg_source_mgr jsrc;
  irr_jpeg_error_mgr jerr;
  jpeg_decompress_struct cinfo;
  u8 *input;
  u8 **rowPtr;
  stringc filename;
  string<char> *in_stack_fffffffffffffad8;
  dimension2d<unsigned_int> *in_stack_fffffffffffffae0;
  undefined8 in_stack_fffffffffffffae8;
  ECOLOR_FORMAT format;
  undefined8 in_stack_fffffffffffffb00;
  undefined2 uVar8;
  void *in_stack_fffffffffffffb08;
  dimension2d<unsigned_int> *size_00;
  ECOLOR_FORMAT format_00;
  dimension2d<unsigned_int> in_stack_fffffffffffffb20;
  uint local_4d8;
  uint local_4d4;
  dimension2d<unsigned_int> local_4c0;
  IImage *local_4b8;
  uint local_4b0;
  uint local_4ac;
  void *local_4a8;
  uint local_4a0;
  u32 local_49c;
  int local_498;
  bool local_491;
  void *local_490;
  undefined8 local_488;
  code *local_480;
  code *local_478;
  code *local_470;
  code *local_468;
  code *local_460;
  undefined4 local_454;
  undefined1 local_450 [168];
  __jmp_buf_tag _Stack_3a8;
  undefined1 *local_2e0;
  undefined8 *local_2d8 [5];
  void **local_2b0;
  u32 local_2a8;
  u32 local_2a4;
  int local_29c;
  undefined4 local_298;
  undefined8 local_288;
  undefined4 local_274;
  uint local_24c;
  int local_248;
  uint local_230;
  void *local_48;
  void *local_40;
  undefined1 local_38 [32];
  dimension2d<unsigned_int> *local_18;
  IImage *local_8;
  
  if (in_RSI == (dimension2d<unsigned_int> *)0x0) {
    local_8 = (IImage *)0x0;
  }
  else {
    local_18 = in_RSI;
    (**(code **)((long)*in_RSI + 0x20))();
    core::string<char>::string((string<char> *)in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
    local_40 = (void *)0x0;
    uVar4 = (**(code **)((long)*local_18 + 0x10))();
    pvVar5 = operator_new__(uVar4);
    size_00 = local_18;
    local_48 = pvVar5;
    uVar6 = (**(code **)((long)*local_18 + 0x10))();
    (**(code **)*size_00)(size_00,pvVar5,uVar6);
    local_2d8[0] = (undefined8 *)jpeg_std_error(local_450);
    *local_2d8[0] = error_exit;
    local_2d8[0][2] = output_message;
    local_2e0 = local_38;
    iVar2 = _setjmp(&_Stack_3a8);
    if (iVar2 == 0) {
      jpeg_CreateDecompress(local_2d8,0x50,0x290);
      local_488 = (**(code **)((long)*local_18 + 0x10))();
      local_490 = local_48;
      local_2b0 = &local_490;
      local_480 = init_source;
      local_478 = fill_input_buffer;
      local_470 = skip_input_data;
      local_468 = jpeg_resync_to_restart;
      local_460 = term_source;
      jpeg_read_header(local_2d8,1);
      if (local_29c != 4) {
        local_298 = 2;
        local_248 = 3;
      }
      else {
        local_298 = 4;
        local_248 = 4;
      }
      local_491 = local_29c == 4;
      local_288 = 0x400199999999999a;
      local_274 = 0;
      bVar1 = checkImageDimensions(local_2a8,local_2a4);
      if (!bVar1) {
        longjmp(&_Stack_3a8,1);
      }
      jpeg_start_decompress(local_2d8);
      local_498 = local_2a8 * local_248;
      local_49c = local_2a8;
      local_4a0 = local_2a4;
      local_4a8 = operator_new__((ulong)(local_498 * local_2a4));
      uVar4 = SUB168(ZEXT416(local_4a0) * ZEXT816(8),0);
      if (SUB168(ZEXT416(local_4a0) * ZEXT816(8),8) != 0) {
        uVar4 = 0xffffffffffffffff;
      }
      local_40 = operator_new__(uVar4);
      for (local_4ac = 0; local_4ac < local_4a0; local_4ac = local_4ac + 1) {
        *(ulong *)((long)local_40 + (ulong)local_4ac * 8) =
             (long)local_4a8 + (ulong)(local_4ac * local_498);
      }
      local_4b0 = 0;
      while( true ) {
        format_00 = (ECOLOR_FORMAT)((ulong)pvVar5 >> 0x20);
        uVar8 = (undefined2)((ulong)in_stack_fffffffffffffb00 >> 0x30);
        format = (ECOLOR_FORMAT)((ulong)in_stack_fffffffffffffae8 >> 0x20);
        if (local_24c <= local_230) break;
        iVar2 = jpeg_read_scanlines(local_2d8,(void *)((long)local_40 + (ulong)local_4b0 * 8),
                                    local_24c - local_4b0);
        local_4b0 = iVar2 + local_4b0;
      }
      if (local_40 != (void *)0x0) {
        operator_delete__(local_40);
      }
      jpeg_finish_decompress(local_2d8);
      jpeg_destroy_decompress(local_2d8);
      local_4b8 = (IImage *)0x0;
      if ((local_491 & 1U) == 0) {
        pIVar7 = (IImage *)operator_new(0x50);
        core::dimension2d<unsigned_int>::dimension2d
                  ((dimension2d<unsigned_int> *)&stack0xfffffffffffffb20,&local_49c,&local_4a0);
        CImage::CImage((CImage *)in_stack_fffffffffffffb20,format_00,size_00,
                       in_stack_fffffffffffffb08,SUB21((ushort)uVar8 >> 8,0),SUB21(uVar8,0));
        local_4b8 = pIVar7;
      }
      else {
        pIVar7 = (IImage *)operator_new(0x50);
        core::dimension2d<unsigned_int>::dimension2d(&local_4c0,&local_49c,&local_4a0);
        CImage::CImage((CImage *)pIVar7,format,in_stack_fffffffffffffae0);
        uVar3 = local_49c * 3 * local_4a0;
        local_4b8 = pIVar7;
        pvVar5 = IImage::getData(pIVar7);
        if (pvVar5 != (void *)0x0) {
          local_4d8 = 0;
          for (local_4d4 = 0; local_4d4 < uVar3; local_4d4 = local_4d4 + 3) {
            *(char *)((long)pvVar5 + (ulong)local_4d4) =
                 (char)(int)((float)*(byte *)((long)local_4a8 + (ulong)(local_4d8 + 2)) *
                            ((float)*(byte *)((long)local_4a8 + (ulong)(local_4d8 + 3)) / 255.0));
            *(char *)((long)pvVar5 + (ulong)(local_4d4 + 1)) =
                 (char)(int)((float)*(byte *)((long)local_4a8 + (ulong)(local_4d8 + 1)) *
                            ((float)*(byte *)((long)local_4a8 + (ulong)(local_4d8 + 3)) / 255.0));
            *(char *)((long)pvVar5 + (ulong)(local_4d4 + 2)) =
                 (char)(int)((float)*(byte *)((long)local_4a8 + (ulong)local_4d8) *
                            ((float)*(byte *)((long)local_4a8 + (ulong)(local_4d8 + 3)) / 255.0));
            local_4d8 = local_4d8 + 4;
          }
        }
        if (local_4a8 != (void *)0x0) {
          operator_delete__(local_4a8);
        }
      }
      if (local_48 != (void *)0x0) {
        operator_delete__(local_48);
      }
      local_8 = local_4b8;
    }
    else {
      jpeg_destroy_decompress(local_2d8);
      if (local_48 != (void *)0x0) {
        operator_delete__(local_48);
      }
      if (local_40 != (void *)0x0) {
        operator_delete__(local_40);
      }
      local_8 = (IImage *)0x0;
    }
    local_454 = 1;
    core::string<char>::~string((string<char> *)0x379a6d);
  }
  return local_8;
}

Assistant:

IImage *CImageLoaderJPG::loadImage(io::IReadFile *file) const
{
	if (!file)
		return 0;

	core::stringc filename = file->getFileName();

	u8 **rowPtr = 0;
	u8 *input = new u8[file->getSize()];
	file->read(input, file->getSize());

	// allocate and initialize JPEG decompression object
	struct jpeg_decompress_struct cinfo;
	struct irr_jpeg_error_mgr jerr;

	// We have to set up the error handler first, in case the initialization
	// step fails.  (Unlikely, but it could happen if you are out of memory.)
	// This routine fills in the contents of struct jerr, and returns jerr's
	// address which we place into the link field in cinfo.

	cinfo.err = jpeg_std_error(&jerr.pub);
	cinfo.err->error_exit = error_exit;
	cinfo.err->output_message = output_message;
	jerr.filename = &filename;

	// compatibility fudge:
	// we need to use setjmp/longjmp for error handling as gcc-linux
	// crashes when throwing within external c code
	if (setjmp(jerr.setjmp_buffer)) {
		// If we get here, the JPEG code has signaled an error.
		// We need to clean up the JPEG object and return.

		jpeg_destroy_decompress(&cinfo);

		delete[] input;
		delete[] rowPtr;

		// return null pointer
		return 0;
	}

	// Now we can initialize the JPEG decompression object.
	jpeg_create_decompress(&cinfo);

	// specify data source
	jpeg_source_mgr jsrc;

	// Set up data pointer
	jsrc.bytes_in_buffer = file->getSize();
	jsrc.next_input_byte = (JOCTET *)input;
	cinfo.src = &jsrc;

	jsrc.init_source = init_source;
	jsrc.fill_input_buffer = fill_input_buffer;
	jsrc.skip_input_data = skip_input_data;
	jsrc.resync_to_restart = jpeg_resync_to_restart;
	jsrc.term_source = term_source;

	// Decodes JPG input from whatever source
	// Does everything AFTER jpeg_create_decompress
	// and BEFORE jpeg_destroy_decompress
	// Caller is responsible for arranging these + setting up cinfo

	// read file parameters with jpeg_read_header()
	jpeg_read_header(&cinfo, TRUE);

	bool useCMYK = false;
	if (cinfo.jpeg_color_space == JCS_CMYK) {
		cinfo.out_color_space = JCS_CMYK;
		cinfo.out_color_components = 4;
		useCMYK = true;
	} else {
		cinfo.out_color_space = JCS_RGB;
		cinfo.out_color_components = 3;
	}
	cinfo.output_gamma = 2.2;
	cinfo.do_fancy_upsampling = FALSE;

	// reject unreasonable sizes
	if (!checkImageDimensions(cinfo.image_width, cinfo.image_height))
		longjmp(jerr.setjmp_buffer, 1);

	// Start decompressor
	jpeg_start_decompress(&cinfo);

	// Get image data
	u32 rowspan = cinfo.image_width * cinfo.out_color_components;
	u32 width = cinfo.image_width;
	u32 height = cinfo.image_height;

	// Allocate memory for buffer
	u8 *output = new u8[rowspan * height];

	// Here we use the library's state variable cinfo.output_scanline as the
	// loop counter, so that we don't have to keep track ourselves.
	// Create array of row pointers for lib
	rowPtr = new u8 *[height];

	for (u32 i = 0; i < height; i++)
		rowPtr[i] = &output[i * rowspan];

	u32 rowsRead = 0;

	while (cinfo.output_scanline < cinfo.output_height)
		rowsRead += jpeg_read_scanlines(&cinfo, &rowPtr[rowsRead], cinfo.output_height - rowsRead);

	delete[] rowPtr;
	// Finish decompression

	jpeg_finish_decompress(&cinfo);

	// Release JPEG decompression object
	// This is an important step since it will release a good deal of memory.
	jpeg_destroy_decompress(&cinfo);

	// convert image
	IImage *image = 0;
	if (useCMYK) {
		image = new CImage(ECF_R8G8B8,
				core::dimension2d<u32>(width, height));
		const u32 size = 3 * width * height;
		u8 *data = (u8 *)image->getData();
		if (data) {
			for (u32 i = 0, j = 0; i < size; i += 3, j += 4) {
				// Also works without K, but has more contrast with K multiplied in
				//				data[i+0] = output[j+2];
				//				data[i+1] = output[j+1];
				//				data[i+2] = output[j+0];
				data[i + 0] = (char)(output[j + 2] * (output[j + 3] / 255.f));
				data[i + 1] = (char)(output[j + 1] * (output[j + 3] / 255.f));
				data[i + 2] = (char)(output[j + 0] * (output[j + 3] / 255.f));
			}
		}
		delete[] output;
	} else
		image = new CImage(ECF_R8G8B8,
				core::dimension2d<u32>(width, height), output);

	delete[] input;

	return image;
}